

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O2

UINT8 okim6295_r(void *chip,UINT8 offset)

{
  long lVar1;
  okim6295_state *info;
  char *pcVar2;
  byte bVar3;
  byte bVar4;
  
  pcVar2 = (char *)((long)chip + 0x38);
  bVar4 = 0xf0;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    bVar3 = (byte)(1 << ((byte)lVar1 & 0x1f));
    if (*pcVar2 == '\0') {
      bVar3 = 0;
    }
    bVar4 = bVar3 | bVar4;
    pcVar2 = pcVar2 + 0x30;
  }
  return bVar4;
}

Assistant:

static UINT8 okim6295_r(void* chip, UINT8 offset)
{
	okim6295_state *info = (okim6295_state *)chip;
	int voicenum;
	UINT8 result;

	result = 0xf0;  // naname expects bits 4-7 to be 1

	// set the bit to 1 if something is playing on a given channel
	for (voicenum = 0; voicenum < OKIM6295_VOICES; voicenum++)
		if (info->voice[voicenum].playing)
			result |= 1 << voicenum;

	return result;
}